

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_value *pVal;
  int iVal;
  byte *pbVar2;
  byte *pbVar3;
  
  pVal = *argv;
  bVar1 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [pVal->flags & 0x1f];
  if (1 < bVar1 - 1) {
    if (bVar1 == 3) {
      pbVar2 = sqlite3_value_text(pVal);
      pbVar3 = pbVar2;
      if (pbVar2 == (byte *)0x0) {
        return;
      }
      do {
        iVal = (int)pbVar3 - (int)pbVar2;
        do {
          bVar1 = *pbVar3;
          if (bVar1 == 0) goto LAB_0018409d;
          pbVar3 = pbVar3 + 1;
          iVal = iVal + 1;
        } while (bVar1 < 0xc0);
      } while( true );
    }
    if (bVar1 != 4) {
      sqlite3_result_null(context);
      return;
    }
  }
  iVal = sqlite3_value_bytes(pVal);
LAB_0018409d:
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      const unsigned char *z0;
      unsigned char c;
      if( z==0 ) return;
      z0 = z;
      while( (c = *z)!=0 ){
        z++;
        if( c>=0xc0 ){
          while( (*z & 0xc0)==0x80 ){ z++; z0++; }
        }
      }
      sqlite3_result_int(context, (int)(z-z0));
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}